

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O0

bool __thiscall Clasp::SharedContext::attach(SharedContext *this,Solver *other)

{
  bool bVar1;
  ValueRep VVar2;
  uint32 uVar3;
  uint32 uVar4;
  size_type sVar5;
  Solver *pSVar6;
  ConfigPtr pCVar7;
  LitVec *pLVar8;
  const_reference pLVar9;
  SatPreprocessor *pSVar10;
  Solver *this_00;
  Constraint *pCVar11;
  Solver *in_RSI;
  long in_RDI;
  Constraint *c;
  Var end_1;
  Var v;
  Literal x;
  size_type end;
  size_type i;
  Antecedent null;
  Var lastVar;
  undefined4 in_stack_ffffffffffffff48;
  Var in_stack_ffffffffffffff4c;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  ConstraintDB *in_stack_ffffffffffffff58;
  Solver *in_stack_ffffffffffffff60;
  Solver *in_stack_ffffffffffffff68;
  uint local_8c;
  undefined8 in_stack_ffffffffffffff78;
  undefined1 aux;
  LitVec *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uint local_38;
  Literal local_34;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  size_type n;
  uint32 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  
  aux = (undefined1)((ulong)in_stack_ffffffffffffff78 >> 0x38);
  uVar3 = (uint32)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  Literal::var((Literal *)(in_RDI + 0x108));
  bVar1 = Solver::validVar((Solver *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                           in_stack_ffffffffffffff4c);
  if (bVar1) {
    Solver::rootLevel(in_RSI);
    bVar1 = Solver::popRootLevel
                      ((Solver *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),uVar3
                       ,in_stack_ffffffffffffff80,(bool)aux);
    if (!bVar1) {
      return false;
    }
    pSVar6 = master((SharedContext *)0x1d6396);
    if (in_RSI == pSVar6) {
      return true;
    }
  }
  initStats((SharedContext *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
            (Solver *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  uVar3 = Solver::numVars((Solver *)0x1d63d1);
  pSVar6 = master((SharedContext *)0x1d63ef);
  bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::size
            (&pSVar6->constraints_);
  pCVar7 = configuration((SharedContext *)0x1d640c);
  uVar4 = Solver::id(in_RSI);
  (*pCVar7->_vptr_Configuration[6])(pCVar7,(ulong)uVar4);
  Solver::startInit((Solver *)CONCAT44(uVar3,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc,
                    (SolverParams *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  bVar1 = Solver::hasConflict((Solver *)0x1d6449);
  if (!bVar1) {
    Antecedent::Antecedent((Antecedent *)&stack0xffffffffffffffd8);
    n = 0;
    pSVar6 = master((SharedContext *)0x1d647e);
    pLVar8 = Solver::trail(pSVar6);
    sVar5 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::size(pLVar8);
    for (; n != sVar5; n = n + 1) {
      pSVar6 = master((SharedContext *)0x1d64b3);
      pLVar8 = Solver::trail(pSVar6);
      pLVar9 = bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::operator[]
                         (pLVar8,n);
      local_34.rep_ = pLVar9->rep_;
      master((SharedContext *)0x1d64dd);
      Literal::var(&local_34);
      bVar1 = Solver::auxVar((Solver *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50)
                             ,in_stack_ffffffffffffff4c);
      if ((!bVar1) &&
         (bVar1 = Solver::force(in_stack_ffffffffffffff68,(Literal *)in_stack_ffffffffffffff60,
                                (Antecedent *)in_stack_ffffffffffffff58), !bVar1)) {
        return false;
      }
    }
    pSVar10 = SingleOwnerPtr<Clasp::SatPreprocessor,_Clasp::DeleteObject>::get
                        ((SingleOwnerPtr<Clasp::SatPreprocessor,_Clasp::DeleteObject> *)0x1d6553);
    if (pSVar10 == (SatPreprocessor *)0x0) {
      local_8c = 0x40000000;
    }
    else {
      local_8c = uVar3 + 1;
    }
    local_38 = local_8c;
    master((SharedContext *)0x1d6589);
    uVar3 = Solver::numVars((Solver *)0x1d6591);
    for (; local_38 <= uVar3; local_38 = local_38 + 1) {
      bVar1 = eliminated((SharedContext *)
                         CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                         in_stack_ffffffffffffff4c);
      if ((bVar1) &&
         (VVar2 = Solver::value((Solver *)
                                CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                                in_stack_ffffffffffffff4c), VVar2 == '\0')) {
        Assignment::eliminate
                  ((Assignment *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                   in_stack_ffffffffffffff4c);
      }
    }
    bVar1 = bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::empty
                      (&in_RSI->constraints_);
    if (bVar1) {
      pSVar6 = master((SharedContext *)0x1d6629);
      *(uint *)&in_RSI->field_0x204 =
           *(uint *)&in_RSI->field_0x204 & 0xc0000000 | *(uint *)&pSVar6->field_0x204 & 0x3fffffff;
    }
    pSVar6 = in_RSI;
    master((SharedContext *)0x1d666e);
    bVar1 = Solver::cloneDB(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    if (bVar1) {
      this_00 = master((SharedContext *)0x1d669d);
      pCVar11 = Solver::enumerationConstraint(this_00);
      if (pCVar11 != (Constraint *)0x0) {
        (*pCVar11->_vptr_Constraint[2])(pCVar11,in_RSI);
      }
      Solver::setEnumerationConstraint
                ((Solver *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                 (Constraint *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      bVar1 = Solver::preparePost(pSVar6);
      if (bVar1) {
        bVar1 = Solver::endInit(pSVar6);
        in_stack_ffffffffffffff57 = 1;
        if (bVar1) {
          return true;
        }
      }
      detach((SharedContext *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
             (Solver *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),false);
    }
  }
  return false;
}

Assistant:

bool SharedContext::attach(Solver& other) {
	assert(frozen() && other.shared_ == this);
	if (other.validVar(step_.var())) {
		if (!other.popRootLevel(other.rootLevel())){ return false; }
		if (&other == master())                    { return true;  }
	}
	initStats(other);
	// 1. clone vars & assignment
	Var lastVar = other.numVars();
	other.startInit(static_cast<uint32>(master()->constraints_.size()), configuration()->solver(other.id()));
	if (other.hasConflict()) { return false; }
	Antecedent null;
	for (LitVec::size_type i = 0, end = master()->trail().size(); i != end; ++i) {
		Literal x = master()->trail()[i];
		if (master()->auxVar(x.var())) { continue;  }
		if (!other.force(x, null))     { return false; }
	}
	for (Var v = satPrepro.get() ? lastVar+1 : varMax, end = master()->numVars(); v <= end; ++v) {
		if (eliminated(v) && other.value(v) == value_free) {
			other.assign_.eliminate(v);
		}
	}
	if (other.constraints_.empty()) { other.lastSimp_ = master()->lastSimp_; }
	// 2. clone & attach constraints
	if (!other.cloneDB(master()->constraints_)) { return false; }
	Constraint* c = master()->enumerationConstraint();
	other.setEnumerationConstraint( c ? c->cloneAttach(other) : 0 );
	// 3. endInit
	return (other.preparePost() && other.endInit()) || (detach(other, false), false);
}